

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int parseHhMmSs(char *zDate,DateTime *p)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *zDate_00;
  bool bVar7;
  double dVar8;
  double dVar9;
  int s;
  int m;
  int h;
  int local_28;
  int nHr;
  
  iVar3 = getDigits(zDate,"20c:20e",&h,&m);
  if (iVar3 != 2) {
    return 1;
  }
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,"20e",&s);
    if (iVar3 != 1) {
      return 1;
    }
    zDate_00 = (byte *)(zDate + 8);
    dVar8 = 0.0;
    if ((zDate[8] == '.') && (uVar5 = (ulong)(byte)zDate[9], 0xfffffffffffffff5 < uVar5 - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      dVar9 = 1.0;
      while (0xfffffffffffffff5 < uVar5 - 0x3a) {
        dVar8 = dVar8 * 10.0 + (double)(int)(char)uVar5 + -48.0;
        dVar9 = dVar9 * 10.0;
        pbVar6 = zDate_00 + 1;
        zDate_00 = zDate_00 + 1;
        uVar5 = (ulong)*pbVar6;
      }
      dVar8 = dVar8 / dVar9;
    }
  }
  else {
    s = 0;
    zDate_00 = (byte *)(zDate + 5);
    dVar8 = 0.0;
  }
  p->validJD = '\0';
  bVar1 = p->field_0x2c;
  p->field_0x2c = bVar1 & 0xfe;
  p->validHMS = '\x01';
  p->h = h;
  p->m = m;
  p->s = (double)s + dVar8;
  do {
    pbVar6 = zDate_00;
    zDate_00 = pbVar6 + 1;
  } while ((""[*pbVar6] & 1) != 0);
  p->tz = 0;
  bVar2 = *pbVar6;
  if (bVar2 == 0x2d) {
    iVar3 = -1;
LAB_0019162d:
    iVar4 = getDigits((char *)zDate_00,"20b:20e",&nHr,&local_28);
    bVar7 = true;
    if (iVar4 != 2) goto LAB_0019168d;
    zDate_00 = pbVar6 + 6;
    p->tz = (nHr * 0x3c + local_28) * iVar3;
LAB_00191676:
    do {
      bVar2 = *zDate_00;
      zDate_00 = zDate_00 + 1;
    } while ((""[bVar2] & 1) != 0);
  }
  else {
    if (bVar2 == 0x2b) {
      iVar3 = 1;
      goto LAB_0019162d;
    }
    if ((bVar2 & 0xdf) == 0x5a) {
      p->field_0x2c = bVar1 & 0xe6 | 8;
      goto LAB_00191676;
    }
  }
  bVar7 = bVar2 != 0;
LAB_0019168d:
  return (uint)bVar7;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  return 0;
}